

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::UncommittedRegionsAccessTestCase::iterate(UncommittedRegionsAccessTestCase *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  bool local_25b;
  bool local_25a;
  bool local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  MessageBuilder local_220;
  uint local_a0;
  int l;
  allocator<char> local_89;
  string local_88 [32];
  uint *local_68;
  GLint *format;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator formIter;
  GLint *target;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  GLuint texture;
  bool result;
  Functions *gl;
  UncommittedRegionsAccessTestCase *this_local;
  Functions *gl_00;
  
  this_00 = deqp::Context::getContextInfo
                      ((this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture2");
  if (bVar1) {
    pRVar4 = deqp::Context::getRenderContext
                       ((this->super_SparseTexture2CommitmentTestCase).
                        super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
    iter._M_current._7_1_ = 1;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          (&(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.mSupportedTargets);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
               &local_38);
    while( true ) {
      target = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                  (&(this->super_SparseTexture2CommitmentTestCase).
                                    super_SparseTextureCommitmentTestCase.mSupportedTargets);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &target);
      if (!bVar1) break;
      formIter._M_current =
           __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_30);
      local_58._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            (&(this->super_SparseTexture2CommitmentTestCase).
                              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_50,
                 &local_58);
      while( true ) {
        format = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                    (&(this->super_SparseTexture2CommitmentTestCase).
                                      super_SparseTextureCommitmentTestCase.
                                      mSupportedInternalFormats);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &format);
        if (!bVar1) break;
        local_68 = (uint *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator*(&local_50);
        uVar3 = (*(this->super_SparseTexture2CommitmentTestCase).
                  super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode
                  ._vptr_TestNode[6])(this,(ulong)(uint)*formIter._M_current,(ulong)*local_68);
        if ((uVar3 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
          std::__cxx11::stringstream::str
                    ((string *)
                     &(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.mLog);
          std::__cxx11::string::~string(local_88);
          std::allocator<char>::~allocator(&local_89);
          poVar5 = std::operator<<((ostream *)
                                   &(this->super_SparseTexture2CommitmentTestCase).
                                    super_SparseTextureCommitmentTestCase.field_0x88,
                                   "Testing uncommitted regions access for target: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*formIter._M_current);
          poVar5 = std::operator<<(poVar5,", format: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_68);
          std::operator<<(poVar5," - ");
          (*(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
            super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
                    (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,3);
          for (local_a0 = 0;
              (int)local_a0 <
              (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mState.levels; local_a0 = local_a0 + 1) {
            uVar3 = (*(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0xc])
                              (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                               (ulong)local_a0);
            if ((uVar3 & 1) != 0) {
              (*(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[10])
                        (this,gl_00,(ulong)(uint)*formIter._M_current,(ulong)*local_68,&iter,
                         (ulong)local_a0);
              local_259 = false;
              if ((iter._M_current._7_1_ & 1) != 0) {
                local_259 = UncommittedReads(this,gl_00,*formIter._M_current,*local_68,
                                             (GLuint *)&iter,local_a0);
              }
              iter._M_current._7_1_ = local_259;
              local_25a = false;
              if (local_259 != false) {
                local_25a = UncommittedAtomicOperations
                                      (this,gl_00,*formIter._M_current,*local_68,(GLuint *)&iter,
                                       local_a0);
              }
              iter._M_current._7_1_ = local_25a;
              local_25b = false;
              if (local_25a != false) {
                local_25b = UncommittedDepthStencil
                                      (this,gl_00,*formIter._M_current,*local_68,(GLuint *)&iter,
                                       local_a0);
              }
              iter._M_current._7_1_ = local_25b;
            }
            if ((iter._M_current._7_1_ & 1) == 0) break;
          }
          gl4cts::Texture::Delete(gl_00,(GLuint *)&iter);
          if ((iter._M_current._7_1_ & 1) == 0) {
            this_01 = tcu::TestContext::getLog
                                ((this->super_SparseTexture2CommitmentTestCase).
                                 super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase
                                 .super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_220,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            std::__cxx11::stringstream::str();
            pMVar6 = tcu::MessageBuilder::operator<<(&local_220,&local_240);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x2c1a0be);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_240);
            tcu::MessageBuilder::~MessageBuilder(&local_220);
            tcu::TestContext::setTestResult
                      ((this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
            return STOP;
          }
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_50);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    tcu::TestContext::setTestResult
              ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_NOT_SUPPORTED,
               "Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult UncommittedRegionsAccessTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing uncommitted regions access for target: " << target << ", format: " << format << " - ";

			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = result && UncommittedReads(gl, target, format, texture, l);
					result = result && UncommittedAtomicOperations(gl, target, format, texture, l);
					result = result && UncommittedDepthStencil(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}